

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyrsa.cpp
# Opt level: O0

RSA * createPublicRSA(string *key)

{
  void *buf;
  BIO *bp;
  char *c_string;
  BIO *keybio;
  RSA *rsa;
  string *key_local;
  
  keybio = (BIO *)0x0;
  rsa = (RSA *)key;
  buf = (void *)std::__cxx11::string::c_str();
  bp = BIO_new_mem_buf(buf,-1);
  if (bp == (BIO *)0x0) {
    key_local = (string *)0x0;
  }
  else {
    keybio = (BIO *)PEM_read_bio_RSAPublicKey(bp,(RSA **)&keybio,(undefined1 *)0x0,(void *)0x0);
    BIO_free(bp);
    key_local = (string *)keybio;
  }
  return (RSA *)key_local;
}

Assistant:

RSA* createPublicRSA(const std::string &key) {
  RSA *rsa = NULL;
  BIO *keybio;
  const char* c_string = key.c_str();
  keybio = BIO_new_mem_buf(reinterpret_cast<const void*>(c_string), -1);
  if (keybio == NULL) { return NULL; }
  rsa = PEM_read_bio_RSAPublicKey(keybio,
                                  &rsa,
                                  NULL,
                                  NULL);
  BIO_free(keybio);
  return rsa;
}